

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void lyp_ext_instance_rm(ly_ctx *ctx,lys_ext_instance ***ext,uint8_t *size,uint8_t index)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  
  iVar3 = (int)CONCAT71(in_register_00000009,index);
  uVar4 = (ulong)(uint)(iVar3 << 3);
  lys_extension_instances_free
            (ctx,*(lys_ext_instance ***)(*(long *)((long)*ext + uVar4) + 0x20),
             (uint)*(byte *)(*(long *)((long)*ext + uVar4) + 0x1a),
             (_func_void_lys_node_ptr_void_ptr *)0x0);
  lydict_remove(ctx,*(char **)(*(long *)((long)*ext + uVar4) + 0x10));
  free(*(void **)((long)*ext + uVar4));
  uVar1 = iVar3 + 1;
  uVar4 = (ulong)*size;
  if ((byte)uVar1 < *size) {
    uVar2 = (ulong)(uVar1 & 0xff);
    do {
      (*ext)[uVar2 - 1] = (*ext)[uVar2];
      uVar2 = uVar2 + 1;
      uVar4 = (ulong)*size;
    } while (uVar2 < uVar4);
  }
  (*ext)[uVar4 - 1] = (lys_ext_instance *)0x0;
  *size = *size + 0xff;
  if (*size != '\0') {
    return;
  }
  free(*ext);
  return;
}

Assistant:

void
lyp_ext_instance_rm(struct ly_ctx *ctx, struct lys_ext_instance ***ext, uint8_t *size, uint8_t index)
{
    uint8_t i;

    lys_extension_instances_free(ctx, (*ext)[index]->ext, (*ext)[index]->ext_size, NULL);
    lydict_remove(ctx, (*ext)[index]->arg_value);
    free((*ext)[index]);

    /* move the rest of the array */
    for (i = index + 1; i < (*size); i++) {
        (*ext)[i - 1] = (*ext)[i];
    }
    /* clean the last cell in the array structure */
    (*ext)[(*size) - 1] = NULL;
    /* the array is not reallocated here, just change its size */
    (*size) = (*size) - 1;

    if (!(*size)) {
        /* ext array is empty */
        free((*ext));
        ext = NULL;
    }
}